

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenetic.c
# Opt level: O2

int array_compare(char *array1,char *array2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (numvars <= lVar3) {
      return 0;
    }
    lVar1 = lVar3 * 4;
    lVar2 = lVar3 * 4;
    lVar3 = lVar3 + 1;
  } while (*(int *)(array1 + lVar1) == *(int *)(array2 + lVar2));
  return 1;
}

Assistant:

static int
array_compare(
  const char * array1,
  const char * array2)
{
    int i;
    int *intarray1, *intarray2;

    intarray1 = (int *) array1;
    intarray2 = (int *) array2;

    for (i = 0; i < numvars; i++) {
        if (intarray1[i] != intarray2[i]) return(1);
    }
    return(0);

}